

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O2

void __thiscall Scs::Server::DisconnectClient(Server *this,ClientID clientId)

{
  iterator __begin1;
  _List_node_base *p_Var1;
  
  std::mutex::lock(&this->m_connectionListMutex);
  p_Var1 = (this->m_connectionList).
           super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->m_connectionList) {
    for (; p_Var1 != (_List_node_base *)&this->m_connectionList; p_Var1 = p_Var1->_M_next) {
      if (*(int *)&p_Var1[1]._M_next[2]._M_next == clientId) {
        *(undefined1 *)((long)(p_Var1[1]._M_next + 2) + 4) = 0;
        break;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_connectionListMutex);
  return;
}

Assistant:

void Server::DisconnectClient(ClientID clientId)
{
	std::lock_guard<std::mutex> lock(m_connectionListMutex);
	if (m_connectionList.empty())
		return;
	for (auto & connection : m_connectionList)
	{
		if (connection->clientID == clientId)
		{
			connection->connected = false;
			return;
		}
	}
}